

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O1

LPBYTE CaptureByteArray(LPBYTE pbDataPtr,LPBYTE pbDataEnd,size_t nLength,LPBYTE pbOutput)

{
  LPBYTE pBVar1;
  
  pBVar1 = pbDataPtr + nLength;
  if (pbDataEnd < pBVar1) {
    pBVar1 = (LPBYTE)0x0;
  }
  else {
    memcpy(pbOutput,pbDataPtr,nLength);
  }
  return pBVar1;
}

Assistant:

LPBYTE CaptureByteArray(LPBYTE pbDataPtr, LPBYTE pbDataEnd, size_t nLength, LPBYTE pbOutput)
{
    // Is there enough data?
    if((pbDataPtr + nLength) > pbDataEnd)
        return NULL;

    // Give data
    memcpy(pbOutput, pbDataPtr, nLength);

    // Return the pointer to data following after the integer
    return pbDataPtr + nLength;
}